

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::FileGenerator::GenerateHeader(FileGenerator *this,Printer *printer)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  FileDescriptor *this_00;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar6;
  MessageGenerator *pMVar7;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *psVar8;
  EnumGenerator *pEVar9;
  scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator> *this_01;
  ServiceGenerator *this_02;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *this_03;
  ExtensionGenerator *this_04;
  int i_00;
  int i_01;
  int local_134;
  int local_130;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  string local_f0;
  string local_d0;
  string local_b0;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  string local_68;
  undefined1 local_38 [8];
  string filename_identifier;
  Printer *printer_local;
  FileGenerator *this_local;
  
  filename_identifier.field_2._8_8_ = printer;
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  FilenameIdentifier((string *)local_38,psVar5);
  uVar1 = filename_identifier.field_2._8_8_;
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  io::Printer::Print((Printer *)uVar1,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#ifndef PROTOBUF_$filename_identifier$__INCLUDED\n#define PROTOBUF_$filename_identifier$__INCLUDED\n\n#include <string>\n\n"
                     ,"filename",psVar5,"filename_identifier",(string *)local_38);
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                     "#include <google/protobuf/stubs/common.h>\n\n");
  uVar1 = filename_identifier.field_2._8_8_;
  SimpleItoa_abi_cxx11_(&local_68,(protobuf *)0x1e9809,i_00);
  SimpleItoa_abi_cxx11_((string *)local_88,(protobuf *)0x1e9809,i_01);
  io::Printer::Print((Printer *)uVar1,
                     "#if GOOGLE_PROTOBUF_VERSION < $min_header_version$\n#error This file was generated by a newer version of protoc which is\n#error incompatible with your Protocol Buffer headers.  Please update\n#error your headers.\n#endif\n#if $protoc_version$ < GOOGLE_PROTOBUF_MIN_PROTOC_VERSION\n#error This file was generated by an older version of protoc which is\n#error incompatible with your Protocol Buffer headers.  Please\n#error regenerate this file with a newer version of protoc.\n#endif\n\n"
                     ,"min_header_version",&local_68,"protoc_version",(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)&local_68);
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                     "#include <google/protobuf/generated_message_util.h>\n");
  iVar3 = FileDescriptor::message_type_count(this->file_);
  if (0 < iVar3) {
    bVar2 = HasDescriptorMethods(this->file_);
    if (bVar2) {
      io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                         "#include <google/protobuf/message.h>\n");
    }
    else {
      io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                         "#include <google/protobuf/message_lite.h>\n");
    }
  }
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                     "#include <google/protobuf/repeated_field.h>\n#include <google/protobuf/extension_set.h>\n"
                    );
  bVar2 = HasDescriptorMethods(this->file_);
  if ((bVar2) && (bVar2 = HasEnumDefinitions(this->file_), bVar2)) {
    io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                       "#include <google/protobuf/generated_enum_reflection.h>\n");
  }
  bVar2 = HasDescriptorMethods(this->file_);
  if (bVar2) {
    io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                       "#include <google/protobuf/generated_message_reflection.h>\n");
    io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                       "#include <google/protobuf/xml/xml_message.h>\n");
  }
  bVar2 = HasGenericServices(this->file_);
  if (bVar2) {
    io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                       "#include <google/protobuf/rpc/rpc_service.h>\n#include <google/protobuf/rpc/rpc_client.h>\n"
                      );
  }
  bVar2 = HasUnknownFields(this->file_);
  if ((bVar2) && (iVar3 = FileDescriptor::message_type_count(this->file_), 0 < iVar3)) {
    io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                       "#include <google/protobuf/unknown_field_set.h>\n");
  }
  for (local_8c = 0; iVar3 = local_8c, iVar4 = FileDescriptor::dependency_count(this->file_),
      uVar1 = filename_identifier.field_2._8_8_, iVar3 < iVar4; local_8c = local_8c + 1) {
    this_00 = FileDescriptor::dependency(this->file_,local_8c);
    psVar5 = FileDescriptor::name_abi_cxx11_(this_00);
    StripProto(&local_b0,psVar5);
    io::Printer::Print((Printer *)uVar1,"#include \"$dependency$.pb.h\"\n","dependency",&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                     "// @@protoc_insertion_point(includes)\n");
  GenerateNamespaceOpeners(this,(Printer *)filename_identifier.field_2._8_8_);
  uVar1 = filename_identifier.field_2._8_8_;
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  GlobalAddDescriptorsName(&local_d0,psVar5);
  io::Printer::Print((Printer *)uVar1,
                     "\n// Internal implementation detail -- do not call these.\nvoid $dllexport_decl$ $adddescriptorsname$();\n"
                     ,"adddescriptorsname",&local_d0,"dllexport_decl",
                     &(this->options_).dllexport_decl);
  std::__cxx11::string::~string((string *)&local_d0);
  uVar1 = filename_identifier.field_2._8_8_;
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  GlobalAssignDescriptorsName(&local_f0,psVar5);
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  GlobalShutdownFileName((string *)&i_2,psVar5);
  io::Printer::Print((Printer *)uVar1,
                     "void $assigndescriptorsname$();\nvoid $shutdownfilename$();\n\n",
                     "assigndescriptorsname",&local_f0,"shutdownfilename",(string *)&i_2);
  std::__cxx11::string::~string((string *)&i_2);
  std::__cxx11::string::~string((string *)&local_f0);
  for (i_3 = 0; iVar3 = FileDescriptor::message_type_count(this->file_), i_3 < iVar3; i_3 = i_3 + 1)
  {
    psVar6 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
             ::operator[](&this->message_generators_,(long)i_3);
    pMVar7 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                       (psVar6);
    MessageGenerator::GenerateForwardDeclaration
              (pMVar7,(Printer *)filename_identifier.field_2._8_8_);
  }
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
  for (i_4 = 0; iVar3 = FileDescriptor::message_type_count(this->file_), i_4 < iVar3; i_4 = i_4 + 1)
  {
    psVar6 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
             ::operator[](&this->message_generators_,(long)i_4);
    pMVar7 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                       (psVar6);
    MessageGenerator::GenerateEnumDefinitions(pMVar7,(Printer *)filename_identifier.field_2._8_8_);
  }
  for (i_5 = 0; iVar3 = FileDescriptor::enum_type_count(this->file_), i_5 < iVar3; i_5 = i_5 + 1) {
    psVar8 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
             ::operator[](&this->enum_generators_,(long)i_5);
    pEVar9 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                       (psVar8);
    EnumGenerator::GenerateDefinition(pEVar9,(Printer *)filename_identifier.field_2._8_8_);
  }
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                     "// ===================================================================\n");
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
  for (i_6 = 0; iVar3 = FileDescriptor::message_type_count(this->file_), i_6 < iVar3; i_6 = i_6 + 1)
  {
    if (0 < i_6) {
      io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
      io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                         "// -------------------------------------------------------------------\n")
      ;
      io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
    }
    psVar6 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
             ::operator[](&this->message_generators_,(long)i_6);
    pMVar7 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                       (psVar6);
    MessageGenerator::GenerateClassDefinition(pMVar7,(Printer *)filename_identifier.field_2._8_8_);
  }
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                     "// ===================================================================\n");
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
  bVar2 = HasGenericServices(this->file_);
  if (bVar2) {
    for (i_7 = 0; iVar3 = FileDescriptor::service_count(this->file_), i_7 < iVar3; i_7 = i_7 + 1) {
      if (0 < i_7) {
        io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
        io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                           "// -------------------------------------------------------------------\n"
                          );
        io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
      }
      this_01 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>_>
                ::operator[](&this->service_generators_,(long)i_7);
      this_02 = internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>::operator->
                          (this_01);
      ServiceGenerator::GenerateDeclarations(this_02,(Printer *)filename_identifier.field_2._8_8_);
    }
    io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
    io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                       "// ===================================================================\n");
    io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
  }
  for (i_8 = 0; iVar3 = FileDescriptor::extension_count(this->file_), i_8 < iVar3; i_8 = i_8 + 1) {
    this_03 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)i_8);
    this_04 = internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->
                        (this_03);
    ExtensionGenerator::GenerateDeclaration(this_04,(Printer *)filename_identifier.field_2._8_8_);
  }
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                     "// ===================================================================\n");
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
  for (i_9 = 0; iVar3 = FileDescriptor::message_type_count(this->file_), i_9 < iVar3; i_9 = i_9 + 1)
  {
    if (0 < i_9) {
      io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                         "// -------------------------------------------------------------------\n")
      ;
      io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,"\n");
    }
    psVar6 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
             ::operator[](&this->message_generators_,(long)i_9);
    pMVar7 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                       (psVar6);
    MessageGenerator::GenerateInlineMethods(pMVar7,(Printer *)filename_identifier.field_2._8_8_);
  }
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                     "\n// @@protoc_insertion_point(namespace_scope)\n");
  GenerateNamespaceClosers(this,(Printer *)filename_identifier.field_2._8_8_);
  bVar2 = HasDescriptorMethods(this->file_);
  if (bVar2) {
    io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                       "\n#ifndef SWIG\nnamespace google {\nnamespace protobuf {\n\n");
    for (local_130 = 0; iVar3 = FileDescriptor::message_type_count(this->file_), local_130 < iVar3;
        local_130 = local_130 + 1) {
      psVar6 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->message_generators_,(long)local_130);
      pMVar7 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                         (psVar6);
      MessageGenerator::GenerateGetEnumDescriptorSpecializations
                (pMVar7,(Printer *)filename_identifier.field_2._8_8_);
    }
    for (local_134 = 0; iVar3 = FileDescriptor::enum_type_count(this->file_), local_134 < iVar3;
        local_134 = local_134 + 1) {
      psVar8 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
               ::operator[](&this->enum_generators_,(long)local_134);
      pEVar9 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                         (psVar8);
      EnumGenerator::GenerateGetEnumDescriptorSpecializations
                (pEVar9,(Printer *)filename_identifier.field_2._8_8_);
    }
    io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                       "\n}  // namespace google\n}  // namespace protobuf\n#endif  // SWIG\n");
  }
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                     "\n// @@protoc_insertion_point(global_scope)\n\n");
  io::Printer::Print((Printer *)filename_identifier.field_2._8_8_,
                     "#endif  // PROTOBUF_$filename_identifier$__INCLUDED\n","filename_identifier",
                     (string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void FileGenerator::GenerateHeader(io::Printer* printer) {
  string filename_identifier = FilenameIdentifier(file_->name());

  // Generate top of header.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n"
    "#ifndef PROTOBUF_$filename_identifier$__INCLUDED\n"
    "#define PROTOBUF_$filename_identifier$__INCLUDED\n"
    "\n"
    "#include <string>\n"
    "\n",
    "filename", file_->name(),
    "filename_identifier", filename_identifier);


  printer->Print(
    "#include <google/protobuf/stubs/common.h>\n"
    "\n");

  // Verify the protobuf library header version is compatible with the protoc
  // version before going any further.
  printer->Print(
    "#if GOOGLE_PROTOBUF_VERSION < $min_header_version$\n"
    "#error This file was generated by a newer version of protoc which is\n"
    "#error incompatible with your Protocol Buffer headers.  Please update\n"
    "#error your headers.\n"
    "#endif\n"
    "#if $protoc_version$ < GOOGLE_PROTOBUF_MIN_PROTOC_VERSION\n"
    "#error This file was generated by an older version of protoc which is\n"
    "#error incompatible with your Protocol Buffer headers.  Please\n"
    "#error regenerate this file with a newer version of protoc.\n"
    "#endif\n"
    "\n",
    "min_header_version",
      SimpleItoa(protobuf::internal::kMinHeaderVersionForProtoc),
    "protoc_version", SimpleItoa(GOOGLE_PROTOBUF_VERSION));

  // OK, it's now safe to #include other files.
  printer->Print(
    "#include <google/protobuf/generated_message_util.h>\n");
  if (file_->message_type_count() > 0) {
    if (HasDescriptorMethods(file_)) {
      printer->Print(
        "#include <google/protobuf/message.h>\n");
    } else {
      printer->Print(
        "#include <google/protobuf/message_lite.h>\n");
    }
  }
  printer->Print(
    "#include <google/protobuf/repeated_field.h>\n"
    "#include <google/protobuf/extension_set.h>\n");

  if (HasDescriptorMethods(file_) && HasEnumDefinitions(file_)) {
    printer->Print(
      "#include <google/protobuf/generated_enum_reflection.h>\n");
  }

  // Add Xml Support -- by chaishushan{AT}gmail.com
  if (HasDescriptorMethods(file_)) {
    printer->Print(
      "#include <google/protobuf/generated_message_reflection.h>\n");
    printer->Print(
      "#include <google/protobuf/xml/xml_message.h>\n");
  }

  // Gen RPC headers -- by chaishushan{AT}gmail.com
  if (HasGenericServices(file_)) {
    printer->Print(
      "#include <google/protobuf/rpc/rpc_service.h>\n"
      "#include <google/protobuf/rpc/rpc_client.h>\n");
  }

  if (HasUnknownFields(file_) && file_->message_type_count() > 0) {
    printer->Print(
      "#include <google/protobuf/unknown_field_set.h>\n");
  }


  for (int i = 0; i < file_->dependency_count(); i++) {
    printer->Print(
      "#include \"$dependency$.pb.h\"\n",
      "dependency", StripProto(file_->dependency(i)->name()));
  }


  printer->Print(
    "// @@protoc_insertion_point(includes)\n");


  // Open namespace.
  GenerateNamespaceOpeners(printer);

  // Forward-declare the AddDescriptors, AssignDescriptors, and ShutdownFile
  // functions, so that we can declare them to be friends of each class.
  printer->Print(
    "\n"
    "// Internal implementation detail -- do not call these.\n"
    "void $dllexport_decl$ $adddescriptorsname$();\n",
    "adddescriptorsname", GlobalAddDescriptorsName(file_->name()),
    "dllexport_decl", options_.dllexport_decl);

  printer->Print(
    // Note that we don't put dllexport_decl on these because they are only
    // called by the .pb.cc file in which they are defined.
    "void $assigndescriptorsname$();\n"
    "void $shutdownfilename$();\n"
    "\n",
    "assigndescriptorsname", GlobalAssignDescriptorsName(file_->name()),
    "shutdownfilename", GlobalShutdownFileName(file_->name()));

  // Generate forward declarations of classes.
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateForwardDeclaration(printer);
  }

  printer->Print("\n");

  // Generate enum definitions.
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateEnumDefinitions(printer);
  }
  for (int i = 0; i < file_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateDefinition(printer);
  }

  printer->Print(kThickSeparator);
  printer->Print("\n");

  // Generate class definitions.
  for (int i = 0; i < file_->message_type_count(); i++) {
    if (i > 0) {
      printer->Print("\n");
      printer->Print(kThinSeparator);
      printer->Print("\n");
    }
    message_generators_[i]->GenerateClassDefinition(printer);
  }

  printer->Print("\n");
  printer->Print(kThickSeparator);
  printer->Print("\n");

  if (HasGenericServices(file_)) {
    // Generate service definitions.
    for (int i = 0; i < file_->service_count(); i++) {
      if (i > 0) {
        printer->Print("\n");
        printer->Print(kThinSeparator);
        printer->Print("\n");
      }
      service_generators_[i]->GenerateDeclarations(printer);
    }

    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
  }

  // Declare extension identifiers.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateDeclaration(printer);
  }

  printer->Print("\n");
  printer->Print(kThickSeparator);
  printer->Print("\n");

  // Generate class inline methods.
  for (int i = 0; i < file_->message_type_count(); i++) {
    if (i > 0) {
      printer->Print(kThinSeparator);
      printer->Print("\n");
    }
    message_generators_[i]->GenerateInlineMethods(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(namespace_scope)\n");

  // Close up namespace.
  GenerateNamespaceClosers(printer);

  // Emit GetEnumDescriptor specializations into google::protobuf namespace:
  if (HasDescriptorMethods(file_)) {
    // The SWIG conditional is to avoid a null-pointer dereference
    // (bug 1984964) in swig-1.3.21 resulting from the following syntax:
    //   namespace X { void Y<Z::W>(); }
    // which appears in GetEnumDescriptor() specializations.
    printer->Print(
        "\n"
        "#ifndef SWIG\n"
        "namespace google {\nnamespace protobuf {\n"
        "\n");
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
    }
    for (int i = 0; i < file_->enum_type_count(); i++) {
      enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
    }
    printer->Print(
        "\n"
        "}  // namespace google\n}  // namespace protobuf\n"
        "#endif  // SWIG\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(global_scope)\n"
    "\n");

  printer->Print(
    "#endif  // PROTOBUF_$filename_identifier$__INCLUDED\n",
    "filename_identifier", filename_identifier);
}